

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

bool __thiscall FIX::Message::setStringHeader(Message *this,string *string)

{
  bool bVar1;
  int iVar2;
  size_type pos;
  FieldBase field;
  size_type local_98;
  FieldBase local_90;
  
  clear(this);
  local_98 = 0;
  if (string->_M_string_length != 0) {
    iVar2 = 0;
    do {
      extractField(&local_90,this,string,&local_98,(DataDictionary *)0x0,(DataDictionary *)0x0,
                   (Group *)0x0);
      if (iVar2 < 3) {
        if ((&headerOrder)[iVar2] != local_90.m_tag) {
          FieldBase::~FieldBase(&local_90);
          return false;
        }
        iVar2 = iVar2 + 1;
      }
      bVar1 = isHeaderField(local_90.m_tag);
      if (!bVar1) {
        FieldBase::~FieldBase(&local_90);
        break;
      }
      std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::push_back
                (&(this->m_header).super_FieldMap.m_fields,&local_90);
      FieldBase::~FieldBase(&local_90);
    } while (local_98 < string->_M_string_length);
  }
  FieldMap::sortFields(&(this->m_header).super_FieldMap);
  return true;
}

Assistant:

bool Message::setStringHeader( const std::string& string )
{
  clear();

  std::string::size_type pos = 0;
  int count = 0;

  while ( pos < string.size() )
  {
    FieldBase field = extractField( string, pos );
    if ( count < 3 && headerOrder[ count++ ] != field.getTag() )
      return false;

    if ( isHeaderField( field ) )
      m_header.appendField( field );
    else break;
  }

  m_header.sortFields();
  return true;
}